

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O1

void cppcms::util::urlencode_impl<std::ostream_iterator<char,char,std::char_traits<char>>>
               (char *b,char *e,ostream_iterator<char,_char,_std::char_traits<char>_> *out)

{
  char *pcVar1;
  byte bVar2;
  undefined8 uVar3;
  undefined8 in_RAX;
  char *__value;
  char c;
  undefined8 uStack_38;
  
  if (b != e) {
    pcVar1 = (char *)((long)&uStack_38 + 7);
    uStack_38 = in_RAX;
    do {
      uVar3 = uStack_38;
      bVar2 = *b;
      uStack_38 = CONCAT17(bVar2,(undefined7)uStack_38);
      __value = pcVar1;
      if ((((9 < (byte)(bVar2 - 0x30)) && (0x19 < (byte)((bVar2 & 0xdf) + 0xbf))) &&
          (1 < bVar2 - 0x2d)) && ((bVar2 != 0x5f && (bVar2 != 0x7e)))) {
        uStack_38._0_7_ = CONCAT16(0x25,(int6)uVar3);
        uStack_38 = CONCAT17(bVar2,(undefined7)uStack_38);
        std::ostream_iterator<char,_char,_std::char_traits<char>_>::operator=
                  (out,(char *)((long)&uStack_38 + 6));
        std::ostream_iterator<char,_char,_std::char_traits<char>_>::operator=
                  (out,"0123456789abcdef" + (bVar2 >> 4));
        __value = "0123456789abcdef" + (bVar2 & 0xf);
      }
      b = (char *)((byte *)b + 1);
      std::ostream_iterator<char,_char,_std::char_traits<char>_>::operator=(out,__value);
    } while (b != e);
  }
  return;
}

Assistant:

void urlencode_impl(char const *b,char const *e,Iterator out)
{
	while(b!=e){
		char c=*b++;
		if(	('a'<=c && c<='z')
			|| ('A'<=c && c<='Z')
			|| ('0'<=c && c<='9'))
		{
			*out++ = c;
		}
		else {
			switch(c) {
				case '-':
				case '_':
				case '.':
				case '~':
					*out++ = c;
					break;
				default:
				{
					static char const hex[]="0123456789abcdef";
					unsigned char uc = c;
					*out++ = '%';
					*out++ = hex[(uc >> 4) & 0xF];
					*out++ = hex[ uc & 0xF];
					
				}
			};
		}
	};
}